

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::
FunctionMockerBase(FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>
                   *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>
  *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_003a08b0;
  MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)>::MockSpec
            ((MockSpec<BasicTestExpr<2>_(TestExprBuilder<5,_BasicTestExpr<1>_>)> *)in_RDI,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}